

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall Js::RegSlotVariablesWalker::PopulateMembers(RegSlotVariablesWalker *this)

{
  DebuggerScope *this_00;
  DiagStackFrame *pDVar1;
  code *pcVar2;
  DebuggerScopePropertyFlags location;
  PropertyId propertyId_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar6;
  byte local_99;
  RegSlot local_84;
  DebuggerPropertyDisplayInfo *local_78;
  DebuggerPropertyDisplayInfo *info;
  Var value;
  DebuggerScopeProperty prop;
  bool isPropertyInDebuggerScope;
  DebuggerScopeProperty debuggerScopeProperty;
  bool isInDeadZone;
  bool isConst;
  PropertyId PStack_3c;
  bool shouldInsert;
  RegSlot reg;
  PropertyId propertyId;
  uint i;
  RegSlot limit;
  DebuggerScope *formalScope;
  PropertyIdOnRegSlotsContainer *propIdContainer;
  ArenaAllocator *arena;
  FunctionBody *pFBody;
  RegSlotVariablesWalker *this_local;
  
  if ((this->super_VariableWalkerBase).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pFBody = (FunctionBody *)this;
    iVar4 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[2])();
    arena = (ArenaAllocator *)
            JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar4));
    iVar4 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
    propIdContainer = (PropertyIdOnRegSlotsContainer *)CONCAT44(extraout_var_00,iVar4);
    formalScope = (DebuggerScope *)
                  FunctionBody::GetPropertyIdOnRegSlotsContainer((FunctionBody *)arena);
    _i = VariableWalkerBase::GetScopeWhenHaltAtFormals(&this->super_VariableWalkerBase);
    if (formalScope != (DebuggerScope *)0x0) {
      if (*(int *)((long)&(formalScope->scopeProperties).ptr + 4) == -1) {
        local_84 = 0xffffffff;
      }
      else {
        local_84 = FunctionBody::MapRegSlot
                             ((FunctionBody *)arena,
                              *(RegSlot *)((long)&(formalScope->scopeProperties).ptr + 4));
      }
      propertyId = local_84;
      pLVar5 = JsUtil::
               List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::New((ArenaAllocator *)propIdContainer,4);
      (this->super_VariableWalkerBase).pMembersList = pLVar5;
      for (reg = 0; reg < *(uint *)&(formalScope->scopeProperties).ptr; reg = reg + 1) {
        PropertyIdOnRegSlotsContainer::FetchItemAt
                  ((PropertyIdOnRegSlotsContainer *)formalScope,reg,(FunctionBody *)arena,
                   &stack0xffffffffffffffc4,(RegSlot *)&debuggerScopeProperty.flags);
        propertyId_00 = PStack_3c;
        location = debuggerScopeProperty.flags;
        debuggerScopeProperty.byteCodeInitializationOffset._3_1_ = 0;
        debuggerScopeProperty.byteCodeInitializationOffset._2_1_ = 0;
        debuggerScopeProperty.byteCodeInitializationOffset._1_1_ = 0;
        if (this->debuggerScope == (DebuggerScope *)0x0) {
          prop.byteCodeInitializationOffset._3_1_ = 0;
          bVar3 = VariableWalkerBase::IsPropertyValid
                            (&this->super_VariableWalkerBase,PStack_3c,debuggerScopeProperty.flags,
                             (bool *)((long)&prop.byteCodeInitializationOffset + 3),
                             (bool *)((long)&debuggerScopeProperty.byteCodeInitializationOffset + 2)
                             ,(bool *)((long)&debuggerScopeProperty.byteCodeInitializationOffset + 1
                                      ));
          local_99 = 0;
          if (bVar3) {
            local_99 = prop.byteCodeInitializationOffset._3_1_ ^ 0xff;
          }
          debuggerScopeProperty.byteCodeInitializationOffset._3_1_ = local_99 & 1;
        }
        else {
          this_00 = this->debuggerScope;
          iVar4 = VariableWalkerBase::GetAdjustedByteCodeOffset(&this->super_VariableWalkerBase);
          bVar3 = DebuggerScope::TryGetValidProperty
                            (this_00,propertyId_00,location,iVar4,
                             (DebuggerScopeProperty *)&prop.flags,
                             (bool *)((long)&debuggerScopeProperty.byteCodeInitializationOffset + 1)
                            );
          if (bVar3) {
            debuggerScopeProperty.byteCodeInitializationOffset._2_1_ =
                 DebuggerScopeProperty::IsConst((DebuggerScopeProperty *)&prop.flags);
            debuggerScopeProperty.byteCodeInitializationOffset._3_1_ = 1;
          }
        }
        if ((debuggerScopeProperty.byteCodeInitializationOffset._3_1_ & 1) != 0) {
          bVar3 = VariableWalkerBase::IsInParamScope(_i,(this->super_VariableWalkerBase).pFrame);
          if (bVar3) {
            if (propertyId == -1) {
              debuggerScopeProperty.byteCodeInitializationOffset._3_1_ =
                   DebuggerScope::HasProperty(_i,PStack_3c);
            }
            else {
              debuggerScopeProperty.byteCodeInitializationOffset._3_1_ =
                   (uint)debuggerScopeProperty.flags <= (uint)propertyId;
            }
          }
          else {
            bVar3 = FunctionBody::IsParamAndBodyScopeMerged((FunctionBody *)arena);
            if ((!bVar3) && (bVar3 = DebuggerScope::HasProperty(_i,PStack_3c), bVar3)) {
              prop.location = 0;
              value._0_4_ = 0;
              DebuggerScope::TryGetProperty
                        (_i,PStack_3c,debuggerScopeProperty.flags,(DebuggerScopeProperty *)&value);
              if ((prop.location & 0x16) != 0) {
                debuggerScopeProperty.byteCodeInitializationOffset._3_1_ = 0;
              }
            }
          }
        }
        if ((debuggerScopeProperty.byteCodeInitializationOffset._3_1_ & 1) != 0) {
          pDVar1 = (this->super_VariableWalkerBase).pFrame;
          iVar4 = (*pDVar1->_vptr_DiagStackFrame[5])
                            (pDVar1,(ulong)(uint)debuggerScopeProperty.flags,0);
          info = (DebuggerPropertyDisplayInfo *)CONCAT44(extraout_var_01,iVar4);
          if ((PStack_3c != 0x1cf) || (info != (DebuggerPropertyDisplayInfo *)0x0)) {
            iVar4 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
            bVar3 = ScriptContext::IsUndeclBlockVar
                              ((ScriptContext *)CONCAT44(extraout_var_02,iVar4),info);
            if (bVar3) {
              debuggerScopeProperty.byteCodeInitializationOffset._1_1_ = 1;
            }
            local_78 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                                 (&this->super_VariableWalkerBase,PStack_3c,
                                  (Var)(ulong)(uint)debuggerScopeProperty.flags,
                                  (bool)(debuggerScopeProperty.byteCodeInitializationOffset._2_1_ &
                                        1),(bool)(debuggerScopeProperty.byteCodeInitializationOffset
                                                  ._1_1_ & 1));
            if (local_78 == (DebuggerPropertyDisplayInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x2fb,"(info != nullptr)","info != nullptr");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add((this->super_VariableWalkerBase).pMembersList,&local_78);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RegSlotVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr)
        {
            Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
            ArenaAllocator *arena = pFrame->GetArena();

            PropertyIdOnRegSlotsContainer *propIdContainer = pFBody->GetPropertyIdOnRegSlotsContainer();

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals();

            // this container can be nullptr if there is no locals in current function.
            if (propIdContainer != nullptr)
            {
                RegSlot limit = propIdContainer->formalsUpperBound == Js::Constants::NoRegister ? Js::Constants::NoRegister : pFBody->MapRegSlot(propIdContainer->formalsUpperBound);

                pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);
                for (uint i = 0; i < propIdContainer->length; i++)
                {
                    Js::PropertyId propertyId;
                    RegSlot reg;
                    propIdContainer->FetchItemAt(i, pFBody, &propertyId, &reg);
                    bool shouldInsert = false;
                    bool isConst = false;
                    bool isInDeadZone = false;

                    if (this->debuggerScope)
                    {
                        DebuggerScopeProperty debuggerScopeProperty;
                        if (this->debuggerScope->TryGetValidProperty(propertyId, reg, GetAdjustedByteCodeOffset(), &debuggerScopeProperty, &isInDeadZone))
                        {
                            isConst = debuggerScopeProperty.IsConst();
                            shouldInsert = true;
                        }
                    }
                    else
                    {
                        bool isPropertyInDebuggerScope = false;
                        shouldInsert = IsPropertyValid(propertyId, reg, &isPropertyInDebuggerScope, &isConst, &isInDeadZone) && !isPropertyInDebuggerScope;
                    }

                    if (shouldInsert)
                    {
                        if (IsInParamScope(formalScope, pFrame))
                        {
                            if (limit != Js::Constants::NoRegister)
                            {
                                shouldInsert = reg <= limit;
                            }
                            else
                            {
                                shouldInsert = formalScope->HasProperty(propertyId);
                            }
                        }
                        else if (!pFBody->IsParamAndBodyScopeMerged() && formalScope->HasProperty(propertyId))
                        {
                            DebuggerScopeProperty prop;
                            prop.flags = DebuggerScopePropertyFlags_None;
                            prop.propId = 0;
                            formalScope->TryGetProperty(propertyId, reg, &prop);
                            if (prop.flags & DebuggerScopePropertyFlags_HasDuplicateInBody)
                            {
                                shouldInsert = false;
                            }
                        }
                    }

                    if (shouldInsert)
                    {
                        Var value = pFrame->GetRegValue(reg);

                        // If the user didn't supply an arguments object, a fake one will
                        // be created when evaluating LocalsWalker::ShouldInsertFakeArguments().
                        if (!(propertyId == PropertyIds::arguments && value == nullptr))
                        {
                            if (pFrame->GetScriptContext()->IsUndeclBlockVar(value))
                            {
                                isInDeadZone = true;
                            }

                            DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                                propertyId,
                                (Var)reg,
                                isConst,
                                isInDeadZone);

                            Assert(info != nullptr);
                            pMembersList->Add(info);
                        }
                    }
                }
            }
        }
    }